

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_value_function.cpp
# Opt level: O3

void __thiscall
duckdb::WindowLeadLagExecutor::EvaluateInternal
          (WindowLeadLagExecutor *this,WindowExecutorGlobalState *gstate,
          WindowExecutorLocalState *lstate,DataChunk *eval_chunk,Vector *result,idx_t count,
          idx_t row_idx)

{
  data_ptr_t pdVar1;
  _func_int **pp_Var2;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  WindowExecutorGlobalState *pWVar4;
  WindowLeadLagExecutor *pWVar5;
  WindowExecutor **ppWVar6;
  int iVar7;
  type pWVar8;
  reference pvVar9;
  reference pvVar10;
  pointer this_00;
  idx_t iVar11;
  long lVar12;
  long lVar13;
  unsigned_long uVar14;
  pointer this_01;
  pointer pEVar15;
  BoundWindowExpression *pBVar16;
  ulong uVar17;
  pointer this_02;
  byte bVar18;
  ulong uVar19;
  idx_t iVar20;
  WindowExecutorLocalState *pWVar21;
  unsigned_long width;
  ulong uVar22;
  ulong source_offset;
  byte bVar23;
  pair<unsigned_long,_unsigned_long> pVar24;
  idx_t delta;
  WindowInputExpression leadlag_default;
  WindowInputExpression leadlag_offset;
  idx_t local_b8;
  WindowExecutorGlobalState *local_b0;
  WindowExecutorLocalState *local_a8;
  ValidityMask **local_a0;
  DataChunk *local_98;
  ColumnDataScanState *local_90;
  WindowLeadLagExecutor *local_88;
  type local_80;
  WindowInputExpression local_78;
  WindowExecutor **local_60;
  WindowInputExpression local_58;
  ulong local_40;
  data_ptr_t local_38;
  
  local_b0 = gstate;
  pWVar8 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
           operator*(&lstate[0x15].range_cursor);
  WindowInputExpression::WindowInputExpression
            (&local_58,eval_chunk,(this->super_WindowValueExecutor).offset_idx);
  WindowInputExpression::WindowInputExpression
            (&local_78,eval_chunk,(this->super_WindowValueExecutor).default_idx);
  pWVar4 = local_b0;
  pWVar21 = lstate + 2;
  local_88 = this;
  local_80 = pWVar8;
  if (local_b0[2].order_mask == (ValidityMask *)0x0) {
    pvVar9 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)pWVar21,0);
    local_38 = pvVar9->data;
    pvVar9 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)pWVar21,1);
    pdVar1 = pvVar9->data;
    local_60 = &pWVar4[2].executor;
    optional_ptr<duckdb::ValidityMask,_true>::CheckValid
              ((optional_ptr<duckdb::ValidityMask,_true> *)local_60);
    pp_Var2 = (pWVar4[2].executor)->_vptr_WindowExecutor;
    pBVar16 = (this->super_WindowValueExecutor).super_WindowExecutor.wexpr;
    _Var3._M_head_impl =
         (pBVar16->offset_expr).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    bVar23 = pp_Var2 == (_func_int **)0x0 && _Var3._M_head_impl == (Expression *)0x0;
    if (_Var3._M_head_impl != (Expression *)0x0 && pp_Var2 == (_func_int **)0x0) {
      pEVar15 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(&pBVar16->offset_expr);
      iVar7 = (*(pEVar15->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar15);
      bVar23 = (byte)iVar7;
      pBVar16 = (this->super_WindowValueExecutor).super_WindowExecutor.wexpr;
    }
    _Var3._M_head_impl =
         (pBVar16->default_expr).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    bVar18 = _Var3._M_head_impl == (Expression *)0x0 & bVar23;
    local_a8 = (WindowExecutorLocalState *)pdVar1;
    local_a0._0_1_ = bVar18;
    if ((_Var3._M_head_impl != (Expression *)0x0) && (bVar23 != 0)) {
      pEVar15 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(&pBVar16->default_expr);
      iVar7 = (*(pEVar15->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar15);
      local_a0._0_1_ = (byte)iVar7;
    }
    if (count != 0) {
      local_40 = row_idx + count;
      local_90 = &pWVar8->state;
      local_98 = &pWVar8->chunk;
      iVar20 = 0;
      local_b0 = (WindowExecutorGlobalState *)count;
      do {
        pWVar5 = local_88;
        pBVar16 = (local_88->super_WindowValueExecutor).super_WindowExecutor.wexpr;
        if ((pBVar16->offset_expr).
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl == (Expression *)0x0) {
          lVar12 = 1;
        }
        else {
          pvVar9 = vector<duckdb::Vector,_true>::operator[]
                             (&(local_58.chunk)->data,local_58.col_idx);
          iVar11 = iVar20;
          if (local_58.scalar != false) {
            iVar11 = 0;
          }
          lVar12 = *(long *)(pvVar9->data + iVar11 * 8);
          pBVar16 = (pWVar5->super_WindowValueExecutor).super_WindowExecutor.wexpr;
        }
        if ((pBVar16->super_Expression).super_BaseExpression.type == WINDOW_LEAD) {
          iVar11 = AddOperatorOverflowCheck::Operation<long,long,long>(row_idx,lVar12);
        }
        else {
          iVar11 = SubtractOperatorOverflowCheck::Operation<long,long,long>(row_idx,lVar12);
        }
        ppWVar6 = local_60;
        local_b8 = 0;
        if ((long)iVar11 < (long)row_idx) {
          local_b8 = row_idx - iVar11;
          optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                    ((optional_ptr<duckdb::ValidityMask,_true> *)local_60);
          iVar11 = WindowBoundariesState::FindPrevStart
                             ((ValidityMask *)*ppWVar6,*(idx_t *)(local_38 + iVar20 * 8),row_idx,
                              &local_b8);
        }
        else if (iVar11 - row_idx != 0 && (long)row_idx <= (long)iVar11) {
          local_b8 = iVar11 - row_idx;
          optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                    ((optional_ptr<duckdb::ValidityMask,_true> *)local_60);
          iVar11 = WindowBoundariesState::FindNextStart
                             ((ValidityMask *)*ppWVar6,row_idx + 1,
                              *(idx_t *)((long)local_a8 + iVar20 * 8),&local_b8);
        }
        pWVar21 = local_a8;
        if ((byte)local_a0 == 0) {
          if (local_b8 == 0) {
            uVar14 = NumericCastImpl<unsigned_long,_long,_false>::Convert(iVar11);
            WindowCursor::CopyCell(pWVar8,0,uVar14,result,iVar20);
          }
          else if ((((pWVar5->super_WindowValueExecutor).super_WindowExecutor.wexpr)->default_expr).
                   super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                   _M_t.
                   super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                   .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl ==
                   (Expression *)0x0) {
            FlatVector::SetNull(result,iVar20,true);
          }
          else {
            pvVar9 = vector<duckdb::Vector,_true>::operator[]
                               (&(local_78.chunk)->data,local_78.col_idx);
            iVar11 = iVar20;
            if (local_78.scalar != false) {
              iVar11 = 0;
            }
            VectorOperations::Copy(pvVar9,result,iVar11 + 1,iVar11,iVar20);
          }
          iVar20 = iVar20 + 1;
          row_idx = row_idx + 1;
        }
        else {
          uVar17 = *(ulong *)((long)local_a8 + iVar20 * 8);
          if (local_40 <= *(ulong *)((long)local_a8 + iVar20 * 8)) {
            uVar17 = local_40;
          }
          uVar22 = uVar17 - row_idx;
          if (local_b8 == 0) {
            uVar17 = NumericCastImpl<unsigned_long,_long,_false>::Convert(iVar11);
            uVar19 = *(long *)((long)pWVar21 + iVar20 * 8) - uVar17;
            if (uVar22 <= *(long *)((long)pWVar21 + iVar20 * 8) - uVar17) {
              uVar19 = uVar22;
            }
            for (; uVar19 != 0; uVar19 = uVar19 - uVar22) {
              uVar22 = (pWVar8->state).current_row_index;
              if ((pWVar8->state).next_row_index <= uVar17 || uVar17 < uVar22) {
                this_02 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                          ::operator->(&pWVar8->paged->inputs);
                ColumnDataCollection::Seek(this_02,uVar17,local_90,local_98);
                uVar22 = (pWVar8->state).current_row_index;
              }
              source_offset = (ulong)(uint)((int)uVar17 - (int)uVar22);
              pvVar9 = vector<duckdb::Vector,_true>::operator[](&local_98->data,0);
              uVar22 = (local_80->chunk).count - source_offset;
              if (uVar19 <= uVar22) {
                uVar22 = uVar19;
              }
              VectorOperations::Copy(pvVar9,result,source_offset + uVar22,source_offset,iVar20);
              iVar20 = iVar20 + uVar22;
              row_idx = row_idx + uVar22;
              uVar17 = uVar17 + uVar22;
              pWVar8 = local_80;
            }
          }
          else {
            if (local_b8 < uVar22) {
              uVar22 = local_b8;
            }
            if ((((pWVar5->super_WindowValueExecutor).super_WindowExecutor.wexpr)->default_expr).
                super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
                super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                _M_t.
                super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl ==
                (Expression *)0x0) {
              uVar19 = uVar22;
              if (uVar17 == row_idx) goto LAB_0179c392;
              do {
                FlatVector::SetNull(result,iVar20,true);
                iVar20 = iVar20 + 1;
                uVar19 = uVar19 - 1;
              } while (uVar19 != 0);
            }
            else {
              pvVar9 = vector<duckdb::Vector,_true>::operator[]
                                 (&(local_78.chunk)->data,local_78.col_idx);
              iVar11 = iVar20;
              if (local_78.scalar != false) {
                iVar11 = 0;
              }
              VectorOperations::Copy(pvVar9,result,iVar11 + uVar22,iVar11,iVar20);
              iVar20 = iVar20 + uVar22;
            }
            row_idx = row_idx + uVar22;
          }
        }
LAB_0179c392:
      } while (iVar20 < local_b0);
    }
  }
  else {
    pvVar9 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)pWVar21,6);
    local_98 = (DataChunk *)pvVar9->data;
    pvVar9 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)pWVar21,7);
    local_90 = (ColumnDataScanState *)pvVar9->data;
    pWVar21 = lstate + 0x14;
    ::std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::resize
              ((vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *)pWVar21,1);
    local_a8 = pWVar21;
    pvVar10 = vector<duckdb::FrameBounds,_true>::operator[]
                        ((vector<duckdb::FrameBounds,_true> *)pWVar21,0);
    if (count != 0) {
      local_a0 = &pWVar4[2].order_mask;
      local_b0 = (WindowExecutorGlobalState *)&pWVar4[2].partition_mask;
      iVar20 = 0;
      do {
        iVar11 = *(idx_t *)((long)local_90 + iVar20 * 8);
        pvVar10->start = *(idx_t *)((long)local_98 + iVar20 * 8);
        pvVar10->end = iVar11;
        this_00 = unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>,_true>
                  ::operator->((unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>,_true>
                                *)local_a0);
        iVar11 = WindowTokenTree::Rank(this_00,pvVar10->start,pvVar10->end,row_idx + iVar20);
        lVar12 = NumericCastImpl<long,_unsigned_long,_false>::Convert(iVar11 - 1);
        pWVar5 = local_88;
        pBVar16 = (local_88->super_WindowValueExecutor).super_WindowExecutor.wexpr;
        if ((pBVar16->offset_expr).
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl == (Expression *)0x0) {
          lVar13 = 1;
        }
        else {
          pvVar9 = vector<duckdb::Vector,_true>::operator[]
                             (&(local_58.chunk)->data,local_58.col_idx);
          iVar11 = iVar20;
          if (local_58.scalar != false) {
            iVar11 = 0;
          }
          lVar13 = *(long *)(pvVar9->data + iVar11 * 8);
          pBVar16 = (pWVar5->super_WindowValueExecutor).super_WindowExecutor.wexpr;
        }
        pWVar8 = local_80;
        if ((pBVar16->super_Expression).super_BaseExpression.type == WINDOW_LEAD) {
          lVar12 = AddOperatorOverflowCheck::Operation<long,long,long>(lVar12,lVar13);
        }
        else {
          lVar12 = SubtractOperatorOverflowCheck::Operation<long,long,long>(lVar12,lVar13);
        }
        lVar13 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pvVar10->end - pvVar10->start)
        ;
        if ((lVar12 < 0) || (lVar13 <= lVar12)) {
          if ((((local_88->super_WindowValueExecutor).super_WindowExecutor.wexpr)->default_expr).
              super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
              super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
              _M_t.
              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl == (Expression *)0x0)
          {
            FlatVector::SetNull(result,iVar20,true);
          }
          else {
            pvVar9 = vector<duckdb::Vector,_true>::operator[]
                               (&(local_78.chunk)->data,local_78.col_idx);
            iVar11 = iVar20;
            if (local_78.scalar != false) {
              iVar11 = 0;
            }
            VectorOperations::Copy(pvVar9,result,iVar11 + 1,iVar11,iVar20);
          }
        }
        else {
          uVar14 = NumericCastImpl<unsigned_long,_long,_false>::Convert(lVar12);
          this_01 = unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
                    ::operator->((unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
                                  *)local_b0);
          pVar24 = WindowIndexTree::SelectNth(this_01,(SubFrames *)local_a8,uVar14);
          if (pVar24.second == 0) {
            WindowCursor::CopyCell(pWVar8,0,pVar24.first,result,iVar20);
          }
          else {
            FlatVector::SetNull(result,iVar20,true);
          }
        }
        iVar20 = iVar20 + 1;
      } while (count != iVar20);
    }
  }
  return;
}

Assistant:

void WindowLeadLagExecutor::EvaluateInternal(WindowExecutorGlobalState &gstate, WindowExecutorLocalState &lstate,
                                             DataChunk &eval_chunk, Vector &result, idx_t count, idx_t row_idx) const {
	auto &glstate = gstate.Cast<WindowLeadLagGlobalState>();
	auto &llstate = lstate.Cast<WindowLeadLagLocalState>();
	auto &cursor = *llstate.cursor;

	WindowInputExpression leadlag_offset(eval_chunk, offset_idx);
	WindowInputExpression leadlag_default(eval_chunk, default_idx);

	if (glstate.row_tree) {
		auto frame_begin = FlatVector::GetData<const idx_t>(llstate.bounds.data[FRAME_BEGIN]);
		auto frame_end = FlatVector::GetData<const idx_t>(llstate.bounds.data[FRAME_END]);
		// TODO: Handle subframes.
		auto &frames = llstate.frames;
		frames.resize(1);
		auto &frame = frames[0];
		for (idx_t i = 0; i < count; ++i, ++row_idx) {
			// (1) compute the ROW_NUMBER of the own row
			frame = FrameBounds(frame_begin[i], frame_end[i]);
			const auto own_row = glstate.row_tree->Rank(frame.start, frame.end, row_idx) - 1;
			// (2) adjust the row number by adding or subtracting an offset
			auto val_idx = NumericCast<int64_t>(own_row);
			int64_t offset = 1;
			if (wexpr.offset_expr) {
				offset = leadlag_offset.GetCell<int64_t>(i);
			}
			if (wexpr.GetExpressionType() == ExpressionType::WINDOW_LEAD) {
				val_idx = AddOperatorOverflowCheck::Operation<int64_t, int64_t, int64_t>(val_idx, offset);
			} else {
				val_idx = SubtractOperatorOverflowCheck::Operation<int64_t, int64_t, int64_t>(val_idx, offset);
			}
			const auto frame_width = NumericCast<int64_t>(frame.end - frame.start);
			if (val_idx >= 0 && val_idx < frame_width) {
				// (3) find the row at that offset
				const auto n = NumericCast<idx_t>(val_idx);
				const auto nth_index = glstate.value_tree->SelectNth(frames, n);
				// (4) evaluate the expression provided to LEAD/LAG on this row.
				if (nth_index.second) {
					//	Overflow
					FlatVector::SetNull(result, i, true);
				} else {
					cursor.CopyCell(0, nth_index.first, result, i);
				}
			} else if (wexpr.default_expr) {
				leadlag_default.CopyCell(result, i);
			} else {
				FlatVector::SetNull(result, i, true);
			}
		}
		return;
	}

	auto partition_begin = FlatVector::GetData<const idx_t>(llstate.bounds.data[PARTITION_BEGIN]);
	auto partition_end = FlatVector::GetData<const idx_t>(llstate.bounds.data[PARTITION_END]);

	auto &ignore_nulls = glstate.ignore_nulls;
	bool can_shift = ignore_nulls->AllValid();
	if (wexpr.offset_expr) {
		can_shift = can_shift && wexpr.offset_expr->IsFoldable();
	}
	if (wexpr.default_expr) {
		can_shift = can_shift && wexpr.default_expr->IsFoldable();
	}

	const auto row_end = row_idx + count;
	for (idx_t i = 0; i < count;) {
		int64_t offset = 1;
		if (wexpr.offset_expr) {
			offset = leadlag_offset.GetCell<int64_t>(i);
		}
		int64_t val_idx = (int64_t)row_idx;
		if (wexpr.GetExpressionType() == ExpressionType::WINDOW_LEAD) {
			val_idx = AddOperatorOverflowCheck::Operation<int64_t, int64_t, int64_t>(val_idx, offset);
		} else {
			val_idx = SubtractOperatorOverflowCheck::Operation<int64_t, int64_t, int64_t>(val_idx, offset);
		}

		idx_t delta = 0;
		if (val_idx < (int64_t)row_idx) {
			// Count backwards
			delta = idx_t(row_idx - idx_t(val_idx));
			val_idx = int64_t(WindowBoundariesState::FindPrevStart(*ignore_nulls, partition_begin[i], row_idx, delta));
		} else if (val_idx > (int64_t)row_idx) {
			delta = idx_t(idx_t(val_idx) - row_idx);
			val_idx =
			    int64_t(WindowBoundariesState::FindNextStart(*ignore_nulls, row_idx + 1, partition_end[i], delta));
		}
		// else offset is zero, so don't move.

		if (can_shift) {
			const auto target_limit = MinValue(partition_end[i], row_end) - row_idx;
			if (!delta) {
				//	Copy source[index:index+width] => result[i:]
				auto index = NumericCast<idx_t>(val_idx);
				const auto source_limit = partition_end[i] - index;
				auto width = MinValue(source_limit, target_limit);
				// We may have to scan multiple blocks here, so loop until we have copied everything
				const idx_t col_idx = 0;
				while (width) {
					const auto source_offset = cursor.Seek(index);
					auto &source = cursor.chunk.data[col_idx];
					const auto copied = MinValue<idx_t>(cursor.chunk.size() - source_offset, width);
					VectorOperations::Copy(source, result, source_offset + copied, source_offset, i);
					i += copied;
					row_idx += copied;
					index += copied;
					width -= copied;
				}
			} else if (wexpr.default_expr) {
				const auto width = MinValue(delta, target_limit);
				leadlag_default.CopyCell(result, i, width);
				i += width;
				row_idx += width;
			} else {
				for (idx_t nulls = MinValue(delta, target_limit); nulls--; ++i, ++row_idx) {
					FlatVector::SetNull(result, i, true);
				}
			}
		} else {
			if (!delta) {
				cursor.CopyCell(0, NumericCast<idx_t>(val_idx), result, i);
			} else if (wexpr.default_expr) {
				leadlag_default.CopyCell(result, i);
			} else {
				FlatVector::SetNull(result, i, true);
			}
			++i;
			++row_idx;
		}
	}
}